

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

void __thiscall
args::CompletionFlag::CompletionFlag<args::ArgumentParser>
          (CompletionFlag *this,ArgumentParser *group_,Matcher *matcher_)

{
  allocator local_62;
  allocator local_61;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"completion",&local_61);
  std::__cxx11::string::string((string *)&local_60,"completion flag",&local_62);
  ValueFlagBase::ValueFlagBase(&this->super_ValueFlagBase,&local_40,&local_60,matcher_,Hidden);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_ValueFlagBase).super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&PTR__CompletionFlag_0011b6a0;
  (this->reply).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->reply).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->reply).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->cword = 0;
  (this->syntax)._M_dataplus._M_p = (pointer)&(this->syntax).field_2;
  (this->syntax)._M_string_length = 0;
  (this->syntax).field_2._M_local_buf[0] = '\0';
  ArgumentParser::AddCompletion(group_,this);
  return;
}

Assistant:

CompletionFlag(GroupClass &group_, Matcher &&matcher_): ValueFlagBase("completion", "completion flag", std::move(matcher_), Options::Hidden)
            {
                group_.AddCompletion(*this);
            }